

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O2

iterator __thiscall
cmLinkedTree<cmState::SnapshotDataType>::Push
          (cmLinkedTree<cmState::SnapshotDataType> *this,iterator it)

{
  iterator iVar1;
  undefined1 auStack_118 [168];
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60 [3];
  
  memset(auStack_118,0,0xe8);
  local_60[0]._M_local_buf[0] = '\0';
  local_70._M_p = (pointer)local_60;
  iVar1 = Push_impl(this,it,(SnapshotDataType *)auStack_118);
  std::__cxx11::string::~string((string *)&local_70);
  return iVar1;
}

Assistant:

iterator Push(iterator it)
  {
    return Push_impl(it, T());
  }